

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O2

void wabt::RenameToContents
               (vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *segs,
               BindingHash *bh)

{
  byte bVar1;
  byte *pbVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *p_Var3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  pointer ppDVar7;
  byte *pbVar8;
  DataSegment *seg;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_90;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *local_88;
  pointer local_80;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_38;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  ppDVar7 = (segs->super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_80 = (segs->super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_90 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              *)bh;
  local_88 = segs;
  do {
    if (ppDVar7 == local_80) {
      std::__cxx11::string::_M_dispose();
      return;
    }
    seg = *ppDVar7;
    std::__cxx11::string::substr((ulong)&local_58,(ulong)&seg->name);
    bVar4 = std::operator!=(&local_58,"d_");
    std::__cxx11::string::_M_dispose();
    if (!bVar4) {
      std::__cxx11::string::assign((char *)&s);
      pbVar8 = (seg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start;
      pbVar2 = (seg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish;
      do {
        if (pbVar8 == pbVar2) {
          if (s._M_string_length < 7) goto LAB_0012b4a9;
          break;
        }
        bVar1 = *pbVar8;
        iVar5 = isalnum((uint)bVar1);
        if ((bVar1 == 0x5f) || (iVar5 != 0)) {
          std::__cxx11::string::push_back((char)&s);
        }
        pbVar8 = pbVar8 + 1;
      } while (s._M_string_length < 0x1e);
      sVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              ::count(local_90,&s);
      p_Var3 = local_90;
      if (sVar6 == 0) {
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
        ::_M_erase(local_90,&seg->name);
        std::__cxx11::string::_M_assign((string *)&seg->name);
        local_58.field_2._M_allocated_capacity._0_4_ = 0;
        local_58.field_2._4_8_ = 0;
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length._0_4_ = 0;
        local_58._M_string_length._4_4_ = 0;
        local_38 = (undefined4)
                   ((ulong)((long)&seg -
                           (long)(local_88->
                                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)p_Var3,&s,&local_58);
      }
    }
LAB_0012b4a9:
    ppDVar7 = ppDVar7 + 1;
  } while( true );
}

Assistant:

void RenameToContents(std::vector<DataSegment*>& segs, BindingHash& bh) {
  std::string s;
  for (auto seg : segs) {
    if (seg->name.substr(0, 2) != "d_") {
      // This segment was named explicitly by a symbol.
      // FIXME: this is not a great check, a symbol could start with d_.
      continue;
    }
    s = "d_";
    for (auto c : seg->data) {
      if (isalnum(c) || c == '_') {
        s += static_cast<char>(c);
      }
      if (s.size() >= max_content_identifier_size) {
        // We truncate any very long names, since those make for hard to
        // format output. They can be somewhat long though, since data segment
        // references tend to not occur that often.
        break;
      }
    }
    if (s.size() < min_content_identifier_size) {
      // It is useful to have a minimum, since if there few printable characters
      // in a data section, that is probably a sign of binary, and those few
      // characters are not going to be very significant.
      continue;
    }
    // We could do the same disambiguition as RenameToIdentifier and
    // GenerateNames do, but if we come up with a clashing name here it is
    // likely a sign of not very meaningful binary data, so it is easier to
    // just keep the original generated name in that case.
    if (bh.count(s) != 0) {
      continue;
    }
    // Remove original entry.
    bh.erase(seg->name);
    seg->name = s;
    bh.emplace(s, Binding(static_cast<Index>(&seg - &segs[0])));
  }
}